

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::handle_reconnect_resp(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  int iVar2;
  char *pcVar3;
  string local_30;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar3 = "rejected";
      if (resp->accepted_ != false) {
        pcVar3 = "accepted";
      }
      msg_if_given_abi_cxx11_
                (&local_30,
                 "got re-connection scheduling response from leader %d to my id %d, result %s",
                 (ulong)(uint)(resp->super_msg_base).src_,(ulong)(uint)(resp->super_msg_base).dst_,
                 pcVar3);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_reconnect_resp",0x3c0,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_reconnect_resp(resp_msg& resp) {
    p_in("got re-connection scheduling response "
         "from leader %d to my id %d, result %s",
         resp.get_src(), resp.get_dst(),
         resp.get_accepted() ? "accepted" : "rejected");
}